

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Vec_Int_t * Gia_ManDetectHalfAdders(Gia_Man_t *p,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint local_74;
  int Counts [5];
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  
  p_00 = Vec_IntAlloc(1000);
  Counts[0] = 0;
  Counts[1] = 0;
  Counts[2] = 0;
  Counts[3] = 0;
  Counts[4] = 0;
  Gia_ManHashStart(p);
  if (p->nXors == 0) {
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
    Gia_ManCreateRefs(p);
    lVar13 = 0;
    while ((iVar12 = (int)lVar13, iVar12 < p->nObjs &&
           (pGVar6 = Gia_ManObj(p,iVar12), pGVar6 != (Gia_Obj_t *)0x0))) {
      if (((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) &&
         (iVar2 = Gia_ObjRecognizeExor(pGVar6,&pFan0,&pFan1), iVar2 != 0)) {
        uVar8 = *(undefined8 *)pGVar6;
        uVar4 = (uint)uVar8 & 0x1fffffff;
        piVar7 = p->pRefs;
        bVar1 = 1 < *(int *)((long)piVar7 + (lVar13 * 4 - (ulong)(uVar4 * 4)));
        if (bVar1) {
          Vec_IntPushTwo(p_00,iVar12,iVar12 - uVar4);
          uVar8 = *(undefined8 *)pGVar6;
          piVar7 = p->pRefs;
        }
        uVar5 = (uint)bVar1;
        uVar4 = (uint)((ulong)uVar8 >> 0x20) & 0x1fffffff;
        if (1 < *(int *)((long)piVar7 + (lVar13 * 4 - (ulong)(uVar4 * 4)))) {
          Vec_IntPushTwo(p_00,iVar12,iVar12 - uVar4);
          uVar5 = uVar5 + 1;
        }
        iVar2 = Gia_ObjId(p,pFan0);
        iVar3 = Gia_ObjId(p,pFan1);
        uVar10 = (uint)(*(ulong *)(pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff)) >> 0x1d) & 1;
        uVar4 = (uint)(*(ulong *)(pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff)) >> 0x3d) & 1;
        if ((uVar10 ^ uVar4) !=
            (((uint)(*(ulong *)(pGVar6 + -(*(ulong *)pGVar6 >> 0x20 & 0x1fffffff)) >> 0x3d) ^
             (uint)(*(ulong *)(pGVar6 + -(*(ulong *)pGVar6 >> 0x20 & 0x1fffffff)) >> 0x1d) & 7) & 1)
           ) {
          __assert_fail("fComplDiff == (Gia_ObjFaninC0(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin1(pObj)))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x5c,"Vec_Int_t *Gia_ManDetectHalfAdders(Gia_Man_t *, int)");
        }
        iVar9 = Abc_Var2Lit(iVar2,0);
        if (uVar10 == uVar4) {
          iVar11 = Abc_Var2Lit(iVar3,1);
          iVar9 = Gia_ManHashLookupInt(p,iVar9,iVar11);
          if (iVar9 != 0) {
            iVar9 = Abc_Lit2Var(iVar9);
            Vec_IntPushTwo(p_00,iVar12,iVar9);
            uVar5 = uVar5 + 1;
          }
          iVar2 = Abc_Var2Lit(iVar2,1);
          iVar9 = 0;
        }
        else {
          iVar11 = Abc_Var2Lit(iVar3,0);
          iVar9 = Gia_ManHashLookupInt(p,iVar9,iVar11);
          if (iVar9 != 0) {
            iVar9 = Abc_Lit2Var(iVar9);
            Vec_IntPushTwo(p_00,iVar12,iVar9);
            uVar5 = uVar5 + 1;
          }
          iVar9 = 1;
          iVar2 = Abc_Var2Lit(iVar2,1);
        }
        iVar3 = Abc_Var2Lit(iVar3,iVar9);
        iVar2 = Gia_ManHashLookupInt(p,iVar2,iVar3);
        if (iVar2 != 0) {
          iVar2 = Abc_Lit2Var(iVar2);
          Vec_IntPushTwo(p_00,iVar12,iVar2);
          uVar5 = uVar5 + 1;
        }
        Counts[uVar5] = Counts[uVar5] + 1;
      }
      lVar13 = lVar13 + 1;
    }
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
  }
  else {
    iVar12 = 0;
    while ((iVar12 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar12), pGVar6 != (Gia_Obj_t *)0x0))) {
      uVar8 = *(undefined8 *)pGVar6;
      uVar4 = (uint)uVar8;
      if (((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) &&
         (iVar2 = Gia_ObjIsXor(pGVar6), iVar2 != 0)) {
        iVar9 = iVar12 - (uVar4 & 0x1fffffff);
        iVar11 = iVar12 - ((uint)((ulong)uVar8 >> 0x20) & 0x1fffffff);
        iVar2 = Abc_Var2Lit(iVar9,0);
        iVar3 = Abc_Var2Lit(iVar11,0);
        iVar2 = Gia_ManHashLookupInt(p,iVar2,iVar3);
        if (iVar2 != 0) {
          iVar3 = Abc_Lit2Var(iVar2);
          Vec_IntPushTwo(p_00,iVar12,iVar3);
        }
        local_74 = (uint)(iVar2 != 0);
        iVar2 = Abc_Var2Lit(iVar9,1);
        iVar3 = Abc_Var2Lit(iVar11,1);
        iVar2 = Gia_ManHashLookupInt(p,iVar2,iVar3);
        if (iVar2 != 0) {
          iVar2 = Abc_Lit2Var(iVar2);
          Vec_IntPushTwo(p_00,iVar12,iVar2);
          local_74 = local_74 + 1;
        }
        iVar2 = Abc_Var2Lit(iVar9,0);
        iVar3 = Abc_Var2Lit(iVar11,1);
        iVar2 = Gia_ManHashLookupInt(p,iVar2,iVar3);
        if (iVar2 != 0) {
          iVar2 = Abc_Lit2Var(iVar2);
          Vec_IntPushTwo(p_00,iVar12,iVar2);
          local_74 = local_74 + 1;
        }
        iVar2 = Abc_Var2Lit(iVar9,1);
        iVar3 = Abc_Var2Lit(iVar11,0);
        iVar2 = Gia_ManHashLookupInt(p,iVar2,iVar3);
        if (iVar2 != 0) {
          iVar2 = Abc_Lit2Var(iVar2);
          Vec_IntPushTwo(p_00,iVar12,iVar2);
          local_74 = local_74 + 1;
        }
        Counts[local_74] = Counts[local_74] + 1;
      }
      iVar12 = iVar12 + 1;
    }
  }
  Gia_ManHashStop(p);
  if (fVerbose != 0) {
    iVar12 = p_00->nSize;
    printf("Found %d half-adders with XOR gates: ",(long)iVar12 / 2 & 0xffffffff,
           (long)iVar12 % 2 & 0xffffffff);
    for (uVar14 = 0; uVar14 != 5; uVar14 = uVar14 + 1) {
      printf("%d=%d ",uVar14 & 0xffffffff,(ulong)(uint)Counts[uVar14]);
    }
    putchar(10);
    for (iVar2 = 1; iVar2 < iVar12; iVar2 = iVar2 + 2) {
      uVar4 = Vec_IntEntry(p_00,iVar2 - 1U);
      uVar5 = Vec_IntEntry(p_00,iVar2);
      pGVar6 = Gia_ManObj(p,uVar4);
      printf("%3d : %5d %5d -> %5d %5d\n",(ulong)(iVar2 - 1U),
             (ulong)(uVar4 - ((uint)*(undefined8 *)pGVar6 & 0x1fffffff)),
             (ulong)(uVar4 - ((uint)((ulong)*(undefined8 *)pGVar6 >> 0x20) & 0x1fffffff)),
             (ulong)uVar4,(ulong)uVar5);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManDetectHalfAdders( Gia_Man_t * p, int fVerbose )
{
    Vec_Int_t * vHadds = Vec_IntAlloc( 1000 );
    Gia_Obj_t * pObj, * pFan0, * pFan1; 
    int i, iLit, iFan0, iFan1, fComplDiff, Count, Counts[5] = {0};
    Gia_ManHashStart( p );
    if ( p->nXors )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsXor(pObj) )
                continue;
            Count = 0;
            iFan0 = Gia_ObjFaninId0(pObj, i);
            iFan1 = Gia_ObjFaninId1(pObj, i);
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 0))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 1))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 1))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 0))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            Counts[Count]++;
        }
    }
    else
    {
        ABC_FREE( p->pRefs );
        Gia_ManCreateRefs( p );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
                continue;
            Count = 0;
            if ( Gia_ObjRefNumId(p, Gia_ObjFaninId0(pObj, i)) > 1 )
                Vec_IntPushTwo( vHadds, i, Gia_ObjFaninId0(pObj, i) ), Count++;
            if ( Gia_ObjRefNumId(p, Gia_ObjFaninId1(pObj, i)) > 1 )
                Vec_IntPushTwo( vHadds, i, Gia_ObjFaninId1(pObj, i) ), Count++;
            iFan0 = Gia_ObjId( p, pFan0 );
            iFan1 = Gia_ObjId( p, pFan1 );
            fComplDiff =          (Gia_ObjFaninC0(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin0(pObj)));
            assert( fComplDiff == (Gia_ObjFaninC0(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin1(pObj))) );
            if ( fComplDiff )
            {
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 0))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 1))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            }
            else
            {
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 1))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 0))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            }
            Counts[Count]++;
        }
        ABC_FREE( p->pRefs );
    }
    Gia_ManHashStop( p );
    if ( fVerbose )
    {
        int iXor, iAnd;
        printf( "Found %d half-adders with XOR gates: ", Vec_IntSize(vHadds)/2 );
        for ( i = 0; i <= 4; i++ )
            printf( "%d=%d ", i, Counts[i] );
        printf( "\n" );

        Vec_IntForEachEntryDouble( vHadds, iXor, iAnd, i )
        {
            pObj = Gia_ManObj( p, iXor );
            printf( "%3d : %5d %5d -> %5d %5d\n", i, Gia_ObjFaninId0(pObj, iXor), Gia_ObjFaninId1(pObj, iXor), iXor, iAnd );
        }
    }
    return vHadds;
}